

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hierarchic_fe.h
# Opt level: O3

MatrixXd * __thiscall
lf::fe::FeHierarchicQuad<double>::EvaluationNodes
          (MatrixXd *__return_storage_ptr__,FeHierarchicQuad<double> *this)

{
  QuadRule *pQVar1;
  long lVar2;
  long lVar3;
  DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *pDVar4;
  scalar_constant_op<double> sVar5;
  Scalar *pSVar6;
  PointerType pdVar7;
  double *pdVar8;
  long lVar9;
  Index row;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  SrcEvaluatorType srcEvaluator;
  DstEvaluatorType dstEvaluator;
  SrcEvaluatorType srcEvaluator_4;
  ulong local_120;
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> local_118;
  uint local_e0;
  assign_op<double,_double> local_d9;
  MatrixXd *local_d8;
  MatrixXd local_d0;
  DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *local_b8;
  PointerType local_b0 [2];
  scalar_constant_op<double> local_a0;
  ulong local_98;
  ulong local_90;
  undefined1 local_88 [16];
  variable_if_dynamic<long,__1> local_78;
  scalar_constant_op<double> local_70;
  RhsNested local_68;
  MatrixXd local_58;
  ulong local_40;
  ulong local_38;
  ulong uVar14;
  
  uVar12 = 0;
  uVar11 = 0;
  if (1 < (this->edge_degrees_)._M_elems[0]) {
    uVar11 = (ulong)(uint)((this->qr_dual_edge_)._M_elems[0]->points_).
                          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                          .m_cols;
  }
  if (1 < (this->edge_degrees_)._M_elems[1]) {
    uVar12 = (ulong)(uint)((this->qr_dual_edge_)._M_elems[1]->points_).
                          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                          .m_cols;
  }
  local_38 = 0;
  local_b8 = (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
             0x0;
  if (1 < (this->edge_degrees_)._M_elems[2]) {
    local_b8 = (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
               (ulong)(uint)((this->qr_dual_edge_)._M_elems[2]->points_).
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_cols;
  }
  if (1 < (this->edge_degrees_)._M_elems[3]) {
    local_38 = (ulong)(uint)((this->qr_dual_edge_)._M_elems[3]->points_).
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_cols;
  }
  local_e0 = 0;
  if (1 < this->interior_degree_) {
    local_e0 = (int)(((this->fe1d_).qr_dual_)->points_).
                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                    m_cols + 2;
  }
  uVar13 = (int)uVar12 + (int)uVar11 + 4;
  uVar14 = (ulong)uVar13;
  uVar13 = (int)local_b8 + uVar13;
  local_40 = (ulong)uVar13;
  uVar13 = (int)local_38 + uVar13;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_data = (double *)0x0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_rows = 0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_cols = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            (&__return_storage_ptr__->
              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,2,
             (ulong)(local_e0 * local_e0 + uVar13));
  local_d8 = __return_storage_ptr__;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                      __return_storage_ptr__,0,0);
  *pSVar6 = 0.0;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                      __return_storage_ptr__,1,0);
  *pSVar6 = 0.0;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                      __return_storage_ptr__,0,1);
  *pSVar6 = 1.0;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                      __return_storage_ptr__,1,1);
  *pSVar6 = 0.0;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                      __return_storage_ptr__,0,2);
  *pSVar6 = 1.0;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                      __return_storage_ptr__,1,2);
  *pSVar6 = 1.0;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                      __return_storage_ptr__,0,3);
  *pSVar6 = 0.0;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                      __return_storage_ptr__,1,3);
  *pSVar6 = 1.0;
  if (1 < (this->edge_degrees_)._M_elems[0]) {
    local_98 = uVar11;
    local_90 = uVar14;
    if (*(this->rel_orient_)._M_ptr == positive) {
      pQVar1 = (this->qr_dual_edge_)._M_elems[0];
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
                (&local_118,__return_storage_ptr__,0,4,1,uVar11);
      local_d0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
           (pQVar1->points_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_data;
      local_d0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
           (pQVar1->points_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_rows;
      Eigen::internal::
      resize_if_allowed<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::Matrix<double,_1,_1,0,_1,_1>,double,double>
                (&local_118,&pQVar1->points_,(assign_op<double,_double> *)&local_58);
      local_88._0_8_ = local_b0;
      local_b0[0] = local_118.
                    super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                    .
                    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                    .
                    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                    .
                    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                    .m_data;
      local_a0.m_other =
           (double)((local_118.
                     super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                     .
                     super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                    .m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                   m_storage.m_rows;
      local_88._8_8_ = &local_d0;
      local_78.m_value = (long)&local_58;
      local_70.m_other = (double)&local_118;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
      ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::assign_op<double,_double>,_0>
             *)local_88);
      __return_storage_ptr__ = local_d8;
    }
    else {
      local_118.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_data
           = (PointerType)&DAT_3ff0000000000000;
      Eigen::
      CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>
      ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                        *)local_b0,1,uVar11,(scalar_constant_op<double> *)&local_118);
      Eigen::
      CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>
      ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                       *)local_88,(Lhs *)local_b0,&(this->qr_dual_edge_)._M_elems[0]->points_,
                      (scalar_difference_op<double,_double> *)&local_118);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
                (&local_118,__return_storage_ptr__,0,4,1,local_98);
      local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
           (Index)local_70.m_other;
      pdVar8 = (local_68->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
               m_storage.m_data;
      lVar2 = (local_68->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
              .m_rows;
      Eigen::internal::
      resize_if_allowed<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,_1,1,1,_1>>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>,double,double>
                (&local_118,
                 (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                  *)local_88,(assign_op<double,_double> *)&local_d0);
      if (0 < local_118.
              super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
              .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
              .
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
              .m_cols.m_value) {
        lVar3 = ((local_118.
                  super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                  .
                  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                 .m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                m_storage.m_rows;
        lVar9 = 0;
        pdVar7 = local_118.
                 super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                 .m_data;
        do {
          if (0 < local_118.
                  super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                  .
                  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                  .m_rows.m_value) {
            lVar10 = 0;
            do {
              pdVar7[lVar10] =
                   (double)local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                           .m_storage.m_cols - pdVar8[lVar10];
              lVar10 = lVar10 + 1;
            } while (local_118.
                     super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                     .
                     super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                     .
                     super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                     .
                     super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                     .m_rows.m_value != lVar10);
          }
          lVar9 = lVar9 + 1;
          pdVar8 = pdVar8 + lVar2;
          pdVar7 = pdVar7 + lVar3;
        } while (lVar9 != local_118.
                          super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                          .
                          super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                          .m_cols.m_value);
      }
    }
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
              (&local_118,__return_storage_ptr__,1,4,1,local_98);
    uVar14 = local_90;
    local_88._0_8_ = (DstEvaluatorType *)0x0;
    Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::
    setConstant((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *
                )&local_118,(Scalar *)local_88);
  }
  if (1 < (this->edge_degrees_)._M_elems[1]) {
    uVar11 = (ulong)((int)uVar11 + 4);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
              (&local_118,__return_storage_ptr__,0,uVar11,1,uVar12);
    local_88._0_8_ = &DAT_3ff0000000000000;
    Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::
    setConstant((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *
                )&local_118,(Scalar *)local_88);
    if ((this->rel_orient_)._M_ptr[1] == positive) {
      pQVar1 = (this->qr_dual_edge_)._M_elems[1];
      local_90 = uVar14;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
                (&local_118,__return_storage_ptr__,1,uVar11,1,uVar12);
      local_d0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
           (pQVar1->points_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_data;
      local_d0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
           (pQVar1->points_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_rows;
      Eigen::internal::
      resize_if_allowed<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::Matrix<double,_1,_1,0,_1,_1>,double,double>
                (&local_118,&pQVar1->points_,(assign_op<double,_double> *)&local_58);
      local_88._0_8_ = local_b0;
      local_b0[0] = local_118.
                    super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                    .
                    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                    .
                    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                    .
                    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                    .m_data;
      local_a0.m_other =
           (double)((local_118.
                     super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                     .
                     super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                    .m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                   m_storage.m_rows;
      local_88._8_8_ = &local_d0;
      local_78.m_value = (long)&local_58;
      local_70.m_other = (double)&local_118;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
      ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::assign_op<double,_double>,_0>
             *)local_88);
      uVar14 = local_90;
    }
    else {
      local_118.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_data
           = (PointerType)&DAT_3ff0000000000000;
      Eigen::
      CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>
      ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                        *)local_b0,1,uVar12,(scalar_constant_op<double> *)&local_118);
      Eigen::
      CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>
      ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                       *)local_88,(Lhs *)local_b0,&(this->qr_dual_edge_)._M_elems[1]->points_,
                      (scalar_difference_op<double,_double> *)&local_118);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
                (&local_118,__return_storage_ptr__,1,uVar11,1,uVar12);
      sVar5.m_other = local_70.m_other;
      pdVar8 = (local_68->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
               m_storage.m_data;
      lVar2 = (local_68->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
              .m_rows;
      Eigen::internal::
      resize_if_allowed<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,_1,1,1,_1>>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>,double,double>
                (&local_118,
                 (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                  *)local_88,(assign_op<double,_double> *)&local_d0);
      if (0 < local_118.
              super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
              .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
              .
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
              .m_cols.m_value) {
        lVar3 = ((local_118.
                  super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                  .
                  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                 .m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                m_storage.m_rows;
        lVar9 = 0;
        pdVar7 = local_118.
                 super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                 .m_data;
        do {
          if (0 < local_118.
                  super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                  .
                  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                  .m_rows.m_value) {
            lVar10 = 0;
            do {
              pdVar7[lVar10] = sVar5.m_other - pdVar8[lVar10];
              lVar10 = lVar10 + 1;
            } while (local_118.
                     super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                     .
                     super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                     .
                     super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                     .
                     super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                     .m_rows.m_value != lVar10);
          }
          lVar9 = lVar9 + 1;
          pdVar8 = pdVar8 + lVar2;
          pdVar7 = pdVar7 + lVar3;
        } while (lVar9 != local_118.
                          super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                          .
                          super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                          .m_cols.m_value);
      }
    }
  }
  pDVar4 = local_b8;
  if (1 < (this->edge_degrees_)._M_elems[2]) {
    if ((this->rel_orient_)._M_ptr[2] == positive) {
      uVar12 = (ulong)local_b8 & 0xffffffff;
      local_118.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_data
           = (PointerType)&DAT_3ff0000000000000;
      Eigen::
      CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>
      ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                        *)local_b0,1,uVar12,(scalar_constant_op<double> *)&local_118);
      Eigen::
      CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>
      ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                       *)local_88,(Lhs *)local_b0,&(this->qr_dual_edge_)._M_elems[2]->points_,
                      (scalar_difference_op<double,_double> *)&local_118);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
                (&local_118,__return_storage_ptr__,0,uVar14 & 0xffffffff,1,uVar12);
      local_b8 = (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>
                  *)local_70.m_other;
      pdVar8 = (local_68->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
               m_storage.m_data;
      lVar2 = (local_68->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
              .m_rows;
      Eigen::internal::
      resize_if_allowed<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,_1,1,1,_1>>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>,double,double>
                (&local_118,
                 (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                  *)local_88,(assign_op<double,_double> *)&local_d0);
      if (0 < local_118.
              super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
              .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
              .
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
              .m_cols.m_value) {
        lVar3 = ((local_118.
                  super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                  .
                  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                 .m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                m_storage.m_rows;
        lVar9 = 0;
        pdVar7 = local_118.
                 super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                 .m_data;
        do {
          if (0 < local_118.
                  super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                  .
                  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                  .m_rows.m_value) {
            lVar10 = 0;
            do {
              pdVar7[lVar10] = (double)local_b8 - pdVar8[lVar10];
              lVar10 = lVar10 + 1;
            } while (local_118.
                     super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                     .
                     super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                     .
                     super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                     .
                     super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                     .m_rows.m_value != lVar10);
          }
          lVar9 = lVar9 + 1;
          pdVar8 = pdVar8 + lVar2;
          pdVar7 = pdVar7 + lVar3;
        } while (lVar9 != local_118.
                          super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                          .
                          super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                          .m_cols.m_value);
      }
    }
    else {
      pQVar1 = (this->qr_dual_edge_)._M_elems[2];
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
                (&local_118,__return_storage_ptr__,0,uVar14 & 0xffffffff,1,
                 (ulong)local_b8 & 0xffffffff);
      local_d0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
           (pQVar1->points_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_data;
      local_d0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
           (pQVar1->points_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_rows;
      Eigen::internal::
      resize_if_allowed<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::Matrix<double,_1,_1,0,_1,_1>,double,double>
                (&local_118,&pQVar1->points_,(assign_op<double,_double> *)&local_58);
      local_88._0_8_ = local_b0;
      local_b0[0] = local_118.
                    super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                    .
                    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                    .
                    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                    .
                    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                    .m_data;
      local_a0.m_other =
           (double)((local_118.
                     super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                     .
                     super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                    .m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                   m_storage.m_rows;
      local_88._8_8_ = &local_d0;
      local_78.m_value = (long)&local_58;
      local_70.m_other = (double)&local_118;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
      ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::assign_op<double,_double>,_0>
             *)local_88);
      __return_storage_ptr__ = local_d8;
    }
    local_120 = (ulong)pDVar4 & 0xffffffff;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
              (&local_118,__return_storage_ptr__,1,uVar14 & 0xffffffff,1,local_120);
    local_88._0_8_ = &DAT_3ff0000000000000;
    Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::
    setConstant((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *
                )&local_118,(Scalar *)local_88);
  }
  if (1 < (this->edge_degrees_)._M_elems[3]) {
    uVar12 = local_40 & 0xffffffff;
    uVar11 = local_38 & 0xffffffff;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
              (&local_118,__return_storage_ptr__,0,uVar12,1,uVar11);
    local_88._0_8_ = (DstEvaluatorType *)0x0;
    Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::
    setConstant((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *
                )&local_118,(Scalar *)local_88);
    if ((this->rel_orient_)._M_ptr[3] == positive) {
      local_118.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_data
           = (PointerType)&DAT_3ff0000000000000;
      Eigen::
      CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>
      ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                        *)local_b0,1,uVar11,(scalar_constant_op<double> *)&local_118);
      Eigen::
      CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>
      ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                       *)local_88,(Lhs *)local_b0,&(this->qr_dual_edge_)._M_elems[3]->points_,
                      (scalar_difference_op<double,_double> *)&local_118);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
                (&local_118,__return_storage_ptr__,1,uVar12,1,uVar11);
      sVar5.m_other = local_70.m_other;
      pdVar8 = (local_68->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
               m_storage.m_data;
      lVar2 = (local_68->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
              .m_rows;
      Eigen::internal::
      resize_if_allowed<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,_1,1,1,_1>>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>,double,double>
                (&local_118,
                 (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                  *)local_88,(assign_op<double,_double> *)&local_d0);
      if (0 < local_118.
              super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
              .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
              .
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
              .m_cols.m_value) {
        lVar3 = ((local_118.
                  super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                  .
                  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                 .m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                m_storage.m_rows;
        lVar9 = 0;
        pdVar7 = local_118.
                 super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                 .m_data;
        do {
          if (0 < local_118.
                  super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                  .
                  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                  .m_rows.m_value) {
            lVar10 = 0;
            do {
              pdVar7[lVar10] = sVar5.m_other - pdVar8[lVar10];
              lVar10 = lVar10 + 1;
            } while (local_118.
                     super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                     .
                     super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                     .
                     super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                     .
                     super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                     .m_rows.m_value != lVar10);
          }
          lVar9 = lVar9 + 1;
          pdVar8 = pdVar8 + lVar2;
          pdVar7 = pdVar7 + lVar3;
        } while (lVar9 != local_118.
                          super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                          .
                          super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                          .m_cols.m_value);
      }
    }
    else {
      pQVar1 = (this->qr_dual_edge_)._M_elems[3];
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
                (&local_118,__return_storage_ptr__,1,uVar12,1,uVar11);
      local_d0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
           (pQVar1->points_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_data;
      local_d0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
           (pQVar1->points_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_rows;
      Eigen::internal::
      resize_if_allowed<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::Matrix<double,_1,_1,0,_1,_1>,double,double>
                (&local_118,&pQVar1->points_,(assign_op<double,_double> *)&local_58);
      local_88._0_8_ = local_b0;
      local_b0[0] = local_118.
                    super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                    .
                    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                    .
                    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                    .
                    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                    .m_data;
      local_a0.m_other =
           (double)((local_118.
                     super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                     .
                     super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                    .m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                   m_storage.m_rows;
      local_88._8_8_ = &local_d0;
      local_78.m_value = (long)&local_58;
      local_70.m_other = (double)&local_118;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
      ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::assign_op<double,_double>,_0>
             *)local_88);
    }
  }
  if (1 < this->interior_degree_) {
    FeHierarchicSegment<double>::EvaluationNodes(&local_d0,&this->fe1d_);
    if (local_e0 != 0) {
      uVar11 = (ulong)local_e0;
      uVar12 = 0;
      do {
        Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
                  (&local_118,local_d8,0,(ulong)uVar13,1,uVar11);
        local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
             local_d0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data;
        local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
             local_d0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_rows;
        Eigen::internal::
        resize_if_allowed<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::Matrix<double,_1,_1,0,_1,_1>,double,double>
                  (&local_118,(Matrix<double,__1,__1,_0,__1,__1> *)&local_d0,&local_d9);
        local_b0[0] = local_118.
                      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                      .
                      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                      .
                      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                      .m_data;
        local_a0.m_other =
             (double)((local_118.
                       super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                       .
                       super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                      .m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                     m_storage.m_rows;
        local_88._0_8_ = local_b0;
        local_88._8_8_ = &local_58;
        local_78.m_value = (long)&local_d9;
        local_70.m_other = (double)&local_118;
        Eigen::internal::
        dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
        ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::assign_op<double,_double>,_0>
               *)local_88);
        Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
                  (&local_118,local_d8,1,(ulong)uVar13,1,uVar11);
        pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                            &local_d0,0,uVar12);
        Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::
        setConstant((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>
                     *)&local_118,pSVar6);
        uVar12 = uVar12 + 1;
        uVar13 = uVar13 + local_e0;
      } while (uVar11 != uVar12);
    }
    free(local_d0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data)
    ;
    __return_storage_ptr__ = local_d8;
  }
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] Eigen::MatrixXd EvaluationNodes() const override {
    const base::size_type Ne0 =
        edge_degrees_[0] > 1 ? qr_dual_edge_[0]->NumPoints() : 0;
    const base::size_type Ne1 =
        edge_degrees_[1] > 1 ? qr_dual_edge_[1]->NumPoints() : 0;
    const base::size_type Ne2 =
        edge_degrees_[2] > 1 ? qr_dual_edge_[2]->NumPoints() : 0;
    const base::size_type Ne3 =
        edge_degrees_[3] > 1 ? qr_dual_edge_[3]->NumPoints() : 0;
    auto Nq = interior_degree_ > 1 ? fe1d_.NumEvaluationNodes() : 0;

    Eigen::MatrixXd nodes(2, 4 + Ne0 + Ne1 + Ne2 + Ne3 + Nq * Nq);
    // Add the vertices
    nodes(0, 0) = 0;
    nodes(1, 0) = 0;
    nodes(0, 1) = 1;
    nodes(1, 1) = 0;
    nodes(0, 2) = 1;
    nodes(1, 2) = 1;
    nodes(0, 3) = 0;
    nodes(1, 3) = 1;
    if (edge_degrees_[0] > 1) {
      // Add the quadrature points on the first edge
      if (rel_orient_[0] == lf::mesh::Orientation::positive) {
        nodes.block(0, 4, 1, Ne0) = qr_dual_edge_[0]->Points();
      } else {
        nodes.block(0, 4, 1, Ne0) =
            Eigen::RowVectorXd::Ones(Ne0) - qr_dual_edge_[0]->Points();
      }
      nodes.block(1, 4, 1, Ne0).setZero();
    }

    if (edge_degrees_[1] > 1) {
      // Add the quadrature points on the second edge
      nodes.block(0, 4 + Ne0, 1, Ne1).setOnes();
      if (rel_orient_[1] == lf::mesh::Orientation::positive) {
        nodes.block(1, 4 + Ne0, 1, Ne1) = qr_dual_edge_[1]->Points();
      } else {
        nodes.block(1, 4 + Ne0, 1, Ne1) =
            Eigen::RowVectorXd::Ones(Ne1) - qr_dual_edge_[1]->Points();
      }
    }
    if (edge_degrees_[2] > 1) {
      // Add the quadrature points on the third edge
      if (rel_orient_[2] == lf::mesh::Orientation::positive) {
        nodes.block(0, 4 + Ne0 + Ne1, 1, Ne2) =
            Eigen::RowVectorXd::Ones(Ne2) - qr_dual_edge_[2]->Points();
      } else {
        nodes.block(0, 4 + Ne0 + Ne1, 1, Ne2) = qr_dual_edge_[2]->Points();
      }
      nodes.block(1, 4 + Ne0 + Ne1, 1, Ne2).setOnes();
    }
    if (edge_degrees_[3] > 1) {
      // Add the quadrature points on the fourth edge
      nodes.block(0, 4 + Ne0 + Ne1 + Ne2, 1, Ne3).setZero();
      if (rel_orient_[3] == lf::mesh::Orientation::positive) {
        nodes.block(1, 4 + Ne0 + Ne1 + Ne2, 1, Ne3) =
            Eigen::RowVectorXd::Ones(Ne3) - qr_dual_edge_[3]->Points();
      } else {
        nodes.block(1, 4 + Ne0 + Ne1 + Ne2, 1, Ne3) =
            qr_dual_edge_[3]->Points();
      }
    }
    if (interior_degree_ > 1) {
      // Add the quadrature points for the face
      auto points = fe1d_.EvaluationNodes();
      for (lf::base::size_type i = 0; i < Nq; ++i) {
        nodes.block(0, 4 + Ne0 + Ne1 + Ne2 + Ne3 + i * Nq, 1, Nq) = points;
        nodes.block(1, 4 + Ne0 + Ne1 + Ne2 + Ne3 + i * Nq, 1, Nq)
            .setConstant(points(0, i));
      }
    }
    return nodes;
  }